

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int urlq_uparse(char *url,size_t sz,urlq_getopt_t *opts)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  coda_url out;
  coda_url local_40;
  
  coda_url::coda_url(&local_40);
  if ((opts->parent).val_len == 0) {
    iVar1 = coda_url::create_absolute(&local_40,url,sz,*(uint *)opts >> 4 & 3);
  }
  else {
    iVar1 = coda_url::create_relative(&local_40,url,sz,*(uint *)opts >> 4 & 3,&opts->parent);
  }
  iVar4 = -1;
  if (iVar1 == 0) {
    pcVar2 = "";
    if (local_40.val_len != 0) {
      pcVar2 = local_40.val_str;
    }
    pcVar5 = "";
    if (local_40.val_len != 0) {
      pcVar5 = local_40.dom_str;
    }
    bVar6 = (undefined1  [48])((undefined1  [48])*opts & (undefined1  [48])0x8) ==
            (undefined1  [48])0x0;
    if (bVar6) {
      pcVar5 = "";
    }
    pcVar3 = "|";
    if (bVar6) {
      pcVar3 = "";
    }
    iVar4 = 0;
    printf("%s%s%s\n",pcVar5,pcVar3,pcVar2);
  }
  coda_url::~coda_url(&local_40);
  return iVar4;
}

Assistant:

int urlq_uparse(const char *url, size_t sz, const urlq_getopt_t *opts)
{
    int rc;
    coda_url out;

    if (opts->parent.empty())
    {
        rc = out.create_absolute(url, sz, opts->uflags);
    }
    else
    {
        rc = out.create_relative(url, sz, opts->uflags, opts->parent);
    }

    if (0 != rc)
    {
        return -1;
    }

    printf("%s%s%s\n", opts->domain ? out.get_domain() : "",
        opts->domain ? "|" : "", out.get_url());

    return 0;
}